

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

int nni_http_conn_getopt(nni_http_conn *conn,char *name,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  nni_mtx_lock(&conn->mtx);
  iVar1 = 7;
  if (conn->closed == false) {
    iVar1 = nni_stream_get(conn->sock,name,buf,szp,t);
  }
  nni_mtx_unlock(&conn->mtx);
  return iVar1;
}

Assistant:

int
nni_http_conn_getopt(
    nni_http_conn *conn, const char *name, void *buf, size_t *szp, nni_type t)
{
	int rv;
	nni_mtx_lock(&conn->mtx);
	if (conn->closed) {
		rv = NNG_ECLOSED;
	} else {
		rv = nni_stream_get(conn->sock, name, buf, szp, t);
	}
	nni_mtx_unlock(&conn->mtx);
	return (rv);
}